

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O1

void xercesc_4_0::XTemplateSerializer::loadObject
               (ValueVectorOf<unsigned_int> **objToLoad,int initSize,bool toCallDestructor,
               XSerializeEngine *serEng)

{
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  MemoryManager *pMVar4;
  ValueVectorOf<unsigned_int> *pVVar5;
  undefined4 extraout_var;
  ulong uVar6;
  uint data;
  XMLSize_t vectorSize;
  uint local_3c;
  XMLSize_t local_38;
  
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    if (*objToLoad == (ValueVectorOf<unsigned_int> *)0x0) {
      pMVar4 = XSerializeEngine::getMemoryManager(serEng);
      pVVar5 = (ValueVectorOf<unsigned_int> *)XMemory::operator_new(0x28,pMVar4);
      pMVar4 = XSerializeEngine::getMemoryManager(serEng);
      uVar6 = 0x10;
      if (-1 < initSize) {
        uVar6 = (ulong)(uint)initSize;
      }
      pVVar5->fCallDestructor = toCallDestructor;
      pVVar5->fCurCount = 0;
      pVVar5->fMaxCount = uVar6;
      pVVar5->fElemList = (uint *)0x0;
      pVVar5->fMemoryManager = pMVar4;
      iVar3 = (*pMVar4->_vptr_MemoryManager[3])(pMVar4);
      pVVar5->fElemList = (uint *)CONCAT44(extraout_var,iVar3);
      memset((uint *)CONCAT44(extraout_var,iVar3),0,pVVar5->fMaxCount << 2);
      *objToLoad = pVVar5;
    }
    XSerializeEngine::registerObject(serEng,*objToLoad);
    local_38 = 0;
    XSerializeEngine::readSize(serEng,&local_38);
    if (local_38 != 0) {
      uVar6 = 0;
      do {
        XSerializeEngine::operator>>(serEng,&local_3c);
        pVVar5 = *objToLoad;
        ValueVectorOf<unsigned_int>::ensureExtraCapacity(pVVar5,1);
        XVar1 = pVVar5->fCurCount;
        pVVar5->fCurCount = XVar1 + 1;
        pVVar5->fElemList[XVar1] = local_3c;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_38);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(ValueVectorOf<unsigned int>**       objToLoad
                                   , int                                 initSize
                                   , bool                                toCallDestructor
                                   , XSerializeEngine&                   serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             ValueVectorOf<unsigned int>(
                                                         initSize
                                                       , serEng.getMemoryManager()
                                                       , toCallDestructor
                                                       );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorSize = 0;
        serEng.readSize (vectorSize);

        for (XMLSize_t i = 0; i < vectorSize; i++)
        {
            unsigned int data;
            serEng>>data;
            (*objToLoad)->addElement(data);
        }
    }

}